

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::Video::Video(Video *this,uint64_t id,Element *element,Document *doc,string *name)

{
  char *pcVar1;
  pointer ppTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_01;
  const_iterator cVar5;
  Element *el;
  Token *pTVar6;
  size_t sVar7;
  uint8_t *puVar8;
  ulong uVar9;
  Token *t;
  Token *t_00;
  Token *t_01;
  Element *el_00;
  ulong uVar10;
  ulong uVar11;
  Element *el_01;
  ulong uVar12;
  _Rb_tree_header *p_Var13;
  Element *el_02;
  element_type *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  pointer local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  Document *local_1b8;
  key_type local_1b0 [12];
  
  local_1b8 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_009cf1c8;
  local_1c0 = &(this->type).field_2;
  (this->type)._M_dataplus._M_p = (pointer)local_1c0;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  local_1c8 = &(this->relativeFileName).field_2;
  (this->relativeFileName)._M_dataplus._M_p = (pointer)local_1c8;
  (this->relativeFileName)._M_string_length = 0;
  (this->relativeFileName).field_2._M_local_buf[0] = '\0';
  local_1d0 = &(this->fileName).field_2;
  (this->fileName)._M_dataplus._M_p = (pointer)local_1d0;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->contentLength = 0;
  this->content = (uint8_t *)0x0;
  this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Type","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_01,local_1b0);
  p_Var13 = &(this_01->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var13) {
    el_01 = (Element *)0x0;
  }
  else {
    el_01 = *(Element **)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"FileName","");
  el = Scope::FindElementCaseInsensitive((Scope *)this_01,local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"RelativeFilename","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_01,local_1b0);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var13) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Content","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_01,local_1b0);
  if ((_Rb_tree_header *)cVar5._M_node == p_Var13) {
    el_02 = (Element *)0x0;
  }
  else {
    el_02 = *(Element **)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if (el_01 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(el_01,0);
    ParseTokenAsString_abi_cxx11_(local_1b0,(FBX *)pTVar6,t);
    std::__cxx11::string::operator=((string *)&this->type,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
  }
  if (el != (Element *)0x0) {
    pTVar6 = GetRequiredToken(el,0);
    ParseTokenAsString_abi_cxx11_(local_1b0,(FBX *)pTVar6,t_00);
    std::__cxx11::string::operator=((string *)&this->fileName,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
  }
  if (el_00 != (Element *)0x0) {
    pTVar6 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(local_1b0,(FBX *)pTVar6,t_01);
    std::__cxx11::string::operator=((string *)&this->relativeFileName,(string *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
  }
  if ((el_02 != (Element *)0x0) &&
     ((el_02->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (el_02->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    pTVar6 = GetRequiredToken(el_02,0);
    pcVar1 = pTVar6->sbegin;
    if (pTVar6->column == 0xffffffff) {
      if ((ulong)((long)pTVar6->send - (long)pcVar1) < 5) {
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,
                   "binary data array is too short, need five (5) bytes for type signature and element count"
                   ,"");
        Util::DOMError(local_1b0,element);
      }
      if (*pcVar1 == 'R') {
        uVar10 = (ulong)*(uint *)(pcVar1 + 1);
        this->contentLength = uVar10;
        puVar8 = (uint8_t *)operator_new__(uVar10);
        this->content = puVar8;
        memcpy(puVar8,pcVar1 + 5,uVar10);
      }
      else {
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"video content is not raw binary data, ignoring","");
        Util::DOMWarning(local_1b0,element);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
          operator_delete(local_1b0[0]._M_dataplus._M_p);
        }
      }
    }
    else {
      if (*pcVar1 != '\"') {
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"embedded content is not surrounded by quotation marks","");
        Util::DOMError(local_1b0,element);
      }
      local_1d8 = (el_02->tokens).
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = (el_02->tokens).
                super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = (long)ppTVar2 - (long)local_1d8 >> 3;
      uVar12 = 0;
      uVar11 = 0;
      if (ppTVar2 != local_1d8) {
        do {
          pTVar6 = GetRequiredToken(el_02,(uint)uVar12);
          sVar7 = Util::ComputeDecodedSizeBase64
                            (pTVar6->sbegin + 1,(size_t)(pTVar6->send + (-2 - (long)pTVar6->sbegin))
                            );
          if (sVar7 == 0) {
            local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Corrupted embedded content found","");
            Util::DOMError(local_1b0,element);
          }
          uVar11 = uVar11 + sVar7;
          uVar12 = (ulong)((uint)uVar12 + 1);
        } while (uVar12 < uVar10);
      }
      if (uVar11 == 0) {
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Corrupted embedded content found","");
        Util::DOMError(local_1b0,element);
      }
      puVar8 = (uint8_t *)operator_new__(uVar11);
      this->content = puVar8;
      this->contentLength = uVar11;
      uVar12 = 0;
      if (ppTVar2 == local_1d8) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          pTVar6 = GetRequiredToken(el_02,(uint)uVar12);
          sVar7 = Util::DecodeBase64(pTVar6->sbegin + 1,
                                     (size_t)(pTVar6->send + (-2 - (long)pTVar6->sbegin)),
                                     this->content + uVar9,uVar11 - uVar9);
          uVar9 = sVar7 + uVar9;
          uVar12 = (ulong)((uint)uVar12 + 1);
        } while (uVar12 < uVar10);
      }
      if (uVar11 != uVar9) {
        if (this->content != (uint8_t *)0x0) {
          operator_delete__(this->content);
        }
        this->contentLength = 0;
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Corrupted embedded content found","");
        Util::DOMError(local_1b0,element);
      }
    }
  }
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Video.FbxVideo","");
  Util::GetPropertyTable((Util *)&local_1f8,local_1b8,local_1b0,element,(Scope *)this_01,false);
  p_Var4 = p_Stack_1f0;
  peVar3 = local_1f8;
  local_1f8 = (element_type *)0x0;
  p_Stack_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar3;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  return;
}

Assistant:

Video::Video(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, contentLength(0)
, content(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc.FindElementCaseInsensitive("FileName");  //some files retain the information as "Filename", others "FileName", who knows
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const Content = sc["Content"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(Content && !Content->Tokens().empty()) {
        //this field is omitted when the embedded texture is already loaded, let's ignore if it's not found
        try {
            const Token& token = GetRequiredToken(*Content, 0);
            const char* data = token.begin();
            if (!token.IsBinary()) {
                if (*data != '"') {
                    DOMError("embedded content is not surrounded by quotation marks", &element);
                }
                else {
                    size_t targetLength = 0;
                    auto numTokens = Content->Tokens().size();
                    // First time compute size (it could be large like 64Gb and it is good to allocate it once)
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        const size_t outLength = Util::ComputeDecodedSizeBase64(base64data, tokenLength);
                        if (outLength == 0)
                        {
                            DOMError("Corrupted embedded content found", &element);
                        }
                        targetLength += outLength;
                    }
                    if (targetLength == 0)
                    {
                        DOMError("Corrupted embedded content found", &element);
                    }
                    content = new uint8_t[targetLength];
                    contentLength = static_cast<uint64_t>(targetLength);
                    size_t dst_offset = 0;
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        dst_offset += Util::DecodeBase64(base64data, tokenLength, content + dst_offset, targetLength - dst_offset);
                    }
                    if (targetLength != dst_offset)
                    {
                        delete[] content;
                        contentLength = 0;
                        DOMError("Corrupted embedded content found", &element);
                    }
                }
            }
            else if (static_cast<size_t>(token.end() - data) < 5) {
                DOMError("binary data array is too short, need five (5) bytes for type signature and element count", &element);
            }
            else if (*data != 'R') {
                DOMWarning("video content is not raw binary data, ignoring", &element);
            }
            else {
                // read number of elements
                uint32_t len = 0;
                ::memcpy(&len, data + 1, sizeof(len));
                AI_SWAP4(len);

                contentLength = len;

                content = new uint8_t[len];
                ::memcpy(content, data + 5, len);
            }
        } catch (const runtime_error& runtimeError)
        {
            //we don't need the content data for contents that has already been loaded
            ASSIMP_LOG_DEBUG_F("Caught exception in FBXMaterial (likely because content was already loaded): ",
                    runtimeError.what());
        }
    }

    props = GetPropertyTable(doc,"Video.FbxVideo",element,sc);
}